

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revert_list.cpp
# Opt level: O2

ListNode * revert_list(ListNode *head)

{
  ListNode *pLVar1;
  ListNode *pLVar2;
  
  pLVar2 = (ListNode *)0x0;
  while (head != (ListNode *)0x0) {
    pLVar1 = head->next;
    head->next = pLVar2;
    pLVar2 = head;
    head = pLVar1;
  }
  return pLVar2;
}

Assistant:

ListNode* revert_list(ListNode* head)
{
	ListNode* prev = nullptr;
	ListNode* next = nullptr;

	while (head) {
		// hanle current node
		next = head->next;
		head->next = prev;

		// move to next node
		prev = head;
		head = next;
	}

	return prev;
}